

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlPrinter::~TiXmlPrinter(TiXmlPrinter *this)

{
  *(undefined ***)this = &PTR__TiXmlPrinter_0019c890;
  TiXmlString::quit(&this->lineBreak);
  TiXmlString::quit(&this->indent);
  TiXmlString::quit(&this->buffer);
  return;
}

Assistant:

TiXmlPrinter() :
		depth(0),
		simpleTextPrint(false),
		buffer(),
		indent("    "),
		lineBreak("\n") {
	}